

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

PipelineResourceSignatureInternalDataVk * __thiscall
Diligent::PipelineResourceSignatureVkImpl::GetInternalData
          (PipelineResourceSignatureInternalDataVk *__return_storage_ptr__,
          PipelineResourceSignatureVkImpl *this)

{
  PipelineResourceSignatureInternalDataVk *InternalData;
  PipelineResourceSignatureVkImpl *this_local;
  
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetInternalData
            (__return_storage_ptr__,
             &this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
  __return_storage_ptr__->DynamicStorageBufferCount = this->m_DynamicStorageBufferCount;
  __return_storage_ptr__->DynamicUniformBufferCount = this->m_DynamicUniformBufferCount;
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureInternalDataVk PipelineResourceSignatureVkImpl::GetInternalData() const
{
    PipelineResourceSignatureInternalDataVk InternalData = TPipelineResourceSignatureBase::GetInternalData();

    InternalData.DynamicStorageBufferCount = m_DynamicStorageBufferCount;
    InternalData.DynamicUniformBufferCount = m_DynamicUniformBufferCount;

    return InternalData;
}